

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O0

int ffdcol(fitsfile *fptr,int colnum,int *status)

{
  int iVar1;
  long lVar2;
  fitsfile *fptr_00;
  long lVar3;
  int *status_00;
  fitsfile *in_RDX;
  int in_ESI;
  int *in_RDI;
  tcolumn *nextcol;
  tcolumn *colptr;
  char comm [73];
  char keyname [75];
  long nspace;
  long nblock;
  LONGLONG tbcol;
  LONGLONG freespace;
  LONGLONG delbyte;
  LONGLONG firstcol;
  LONGLONG naxis2;
  LONGLONG naxis1;
  LONGLONG nbytes;
  LONGLONG ndelete;
  LONGLONG size;
  LONGLONG firstbyte;
  int tstatus;
  int ii;
  int *in_stack_00000a18;
  long in_stack_00000a20;
  fitsfile *in_stack_00000a28;
  int *in_stack_00002600;
  LONGLONG in_stack_00002608;
  LONGLONG in_stack_00002610;
  LONGLONG in_stack_00002618;
  LONGLONG in_stack_00002620;
  fitsfile *in_stack_00002628;
  int *in_stack_00018578;
  LONGLONG in_stack_00018580;
  LONGLONG in_stack_00018588;
  LONGLONG in_stack_00018590;
  fitsfile *in_stack_00018598;
  int *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef4;
  int *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  LONGLONG *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  fitsfile *in_stack_ffffffffffffff18;
  int *in_stack_ffffffffffffff20;
  int *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff34;
  fitsfile *in_stack_ffffffffffffff38;
  long local_78;
  long local_68;
  long local_60;
  int *status_01;
  char *comm_00;
  LONGLONG in_stack_ffffffffffffffb8;
  int *in_stack_ffffffffffffffc0;
  fitsfile *in_stack_ffffffffffffffc8;
  int colmax;
  int in_stack_ffffffffffffffdc;
  int local_4;
  
  if (in_RDX->HDUposition < 1) {
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
         (iVar1 = ffrdef(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0), 0 < iVar1)) {
        return in_RDX->HDUposition;
      }
    }
    else {
      ffmahd(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,in_stack_ffffffffffffff28,
             in_stack_ffffffffffffff20);
    }
    if (*(int *)(*(long *)(in_RDI + 2) + 0x58) == 0) {
      ffpmsg((char *)0x13b5ec);
      in_RDX->HDUposition = 0xeb;
      local_4 = 0xeb;
    }
    else if ((in_ESI < 1) || (*(int *)(*(long *)(in_RDI + 2) + 0x3b0) < in_ESI)) {
      in_RDX->HDUposition = 0x12e;
      local_4 = 0x12e;
    }
    else {
      lVar2 = *(long *)(*(long *)(in_RDI + 2) + 0x3d0) + (long)(in_ESI + -1) * 0xa0;
      local_60 = *(long *)(lVar2 + 0x48);
      if (*(int *)(*(long *)(in_RDI + 2) + 0x58) == 1) {
        local_68 = *(long *)(lVar2 + 0x98);
        if (in_ESI < *(int *)(*(long *)(in_RDI + 2) + 0x3b0)) {
          if (0 < (*(long *)(lVar2 + 0xe8) - *(long *)(lVar2 + 0x48)) - local_68) {
            local_68 = local_68 + 1;
          }
        }
        else if ((1 < in_ESI) &&
                (0 < (*(long *)(lVar2 + 0x48) - *(long *)(lVar2 + -0x58)) - *(long *)(lVar2 + -8)))
        {
          local_68 = local_68 + 1;
          local_60 = local_60 + -1;
        }
      }
      else if (in_ESI < *(int *)(*(long *)(in_RDI + 2) + 0x3b0)) {
        local_68 = *(long *)(lVar2 + 0xe8) - *(long *)(lVar2 + 0x48);
      }
      else {
        local_68 = *(long *)(*(long *)(in_RDI + 2) + 0x3c8) - *(long *)(lVar2 + 0x48);
      }
      comm_00 = *(char **)(*(long *)(in_RDI + 2) + 0x3c8);
      status_01 = *(int **)(*(long *)(in_RDI + 2) + 0x3c0);
      fptr_00 = (fitsfile *)
                (*(long *)(*(long *)(in_RDI + 2) + 0x3d8) + *(long *)(*(long *)(in_RDI + 2) + 0x3e0)
                );
      lVar2 = (local_68 * (long)status_01 + ((long)((long)&fptr_00[0xb3].Fptr + 7) / 0xb40) * 0xb40)
              - (long)fptr_00;
      ffcdel(in_stack_00002628,in_stack_00002620,in_stack_00002618,in_stack_00002610,
             in_stack_00002608,in_stack_00002600);
      lVar3 = *(long *)(*(long *)(in_RDI + 2) + 0x88) + *(long *)(*(long *)(in_RDI + 2) + 0x3d8);
      status_00 = (int *)(local_68 * (long)status_01);
      if (0 < *(long *)(*(long *)(in_RDI + 2) + 0x3e0)) {
        in_stack_ffffffffffffffb8 = *(LONGLONG *)(*(long *)(in_RDI + 2) + 0x3e0);
        iVar1 = ffshft(in_stack_00018598,in_stack_00018590,in_stack_00018588,in_stack_00018580,
                       in_stack_00018578);
        if (0 < iVar1) {
          return in_RDX->HDUposition;
        }
      }
      if (0 < lVar2 / 0xb40) {
        ffdblk(in_stack_00000a28,in_stack_00000a20,in_stack_00000a18);
      }
      *(long *)(*(long *)(in_RDI + 2) + 0x3d8) =
           *(long *)(*(long *)(in_RDI + 2) + 0x3d8) - (long)status_00;
      colmax = 0;
      ffmkyj(fptr_00,(char *)status_00,in_stack_ffffffffffffffb8,comm_00,status_01);
      iVar1 = (int)((ulong)lVar3 >> 0x20);
      if (*(int *)(*(long *)(in_RDI + 2) + 0x58) == 1) {
        for (in_stack_ffffffffffffffdc = 1; iVar1 = (int)((ulong)lVar3 >> 0x20),
            in_stack_ffffffffffffffdc <= *(int *)(*(long *)(in_RDI + 2) + 0x3b0);
            in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc + 1) {
          ffkeyn((char *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                 in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
          ffgkyjj(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                  in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
          if (local_60 < local_78) {
            local_78 = local_78 - local_68;
            ffmkyj(fptr_00,(char *)status_00,in_stack_ffffffffffffffb8,comm_00,status_01);
          }
        }
      }
      ffmkyj(fptr_00,(char *)status_00,in_stack_ffffffffffffffb8,comm_00,status_01);
      ffmkyj(fptr_00,(char *)status_00,in_stack_ffffffffffffffb8,comm_00,status_01);
      ffkshf(in_RDX,in_stack_ffffffffffffffdc,colmax,iVar1,&fptr_00->HDUposition);
      ffrdef(fptr_00,status_00);
      local_4 = in_RDX->HDUposition;
    }
  }
  else {
    local_4 = in_RDX->HDUposition;
  }
  return local_4;
}

Assistant:

int ffdcol(fitsfile *fptr,  /* I - FITS file pointer                        */
           int colnum,      /* I - column to delete (1 = 1st)               */
           int *status)     /* IO - error status                            */
/*
  Delete a column from a table.
*/
{
    int ii, tstatus;
    LONGLONG firstbyte, size, ndelete, nbytes, naxis1, naxis2, firstcol, delbyte, freespace;
    LONGLONG tbcol;
    long nblock, nspace;
    char keyname[FLEN_KEYWORD], comm[FLEN_COMMENT];
    tcolumn *colptr, *nextcol;

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
    /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    if ((fptr->Fptr)->hdutype == IMAGE_HDU)
    {
       ffpmsg
       ("Can only delete column from TABLE or BINTABLE extension (ffdcol)");
       return(*status = NOT_TABLE);
    }

    if (colnum < 1 || colnum > (fptr->Fptr)->tfield )
        return(*status = BAD_COL_NUM);

    colptr = (fptr->Fptr)->tableptr;
    colptr += (colnum - 1);
    firstcol = colptr->tbcol;  /* starting byte position of the column */

    /* use column width to determine how many bytes to delete in each row */
    if ((fptr->Fptr)->hdutype == ASCII_TBL)
    {
      delbyte = colptr->twidth;  /* width of ASCII column */

      if (colnum < (fptr->Fptr)->tfield) /* check for space between next column */
      {
        nextcol = colptr + 1;
        nspace = (long) ((nextcol->tbcol) - (colptr->tbcol) - delbyte);
        if (nspace > 0)
            delbyte++;
      }
      else if (colnum > 1)   /* check for space between last 2 columns */
      {
        nextcol = colptr - 1;
        nspace = (long) ((colptr->tbcol) - (nextcol->tbcol) - (nextcol->twidth));
        if (nspace > 0)
        {
           delbyte++;
           firstcol--;  /* delete the leading space */
        }
      }
    }
    else   /* a binary table */
    {
      if (colnum < (fptr->Fptr)->tfield)
      {
         nextcol = colptr + 1;
         delbyte = (nextcol->tbcol) - (colptr->tbcol);
      }
      else
      {
         delbyte = ((fptr->Fptr)->rowlength) - (colptr->tbcol);
      }
    }

    naxis1 = (fptr->Fptr)->rowlength;   /* current width of the table */
    naxis2 = (fptr->Fptr)->numrows;

    /* current size of table */
    size = (fptr->Fptr)->heapstart + (fptr->Fptr)->heapsize;
    freespace = ((LONGLONG)delbyte * naxis2) + ((size + 2879) / 2880) * 2880 - size;
    nblock = (long) (freespace / 2880);   /* number of empty blocks to delete */

    ffcdel(fptr, naxis1, naxis2, delbyte, firstcol, status); /* delete col */

    /* absolute heap position */
    firstbyte = (fptr->Fptr)->datastart + (fptr->Fptr)->heapstart;
    ndelete = (LONGLONG)delbyte * naxis2; /* size of shift */

    /* shift heap up (if it exists) */
    if ((fptr->Fptr)->heapsize > 0)
    {
      nbytes = (fptr->Fptr)->heapsize;    /* no. of bytes to shift up */

      if (ffshft(fptr, firstbyte, nbytes, -ndelete, status) > 0) /* mv heap */
          return(*status);
    }

    /* delete the empty  blocks at the end of the HDU */
    if (nblock > 0)
        ffdblk(fptr, nblock, status);

    /* update the heap starting address */
    (fptr->Fptr)->heapstart -= ndelete;

    /* update the THEAP keyword if it exists */
    tstatus = 0;
    ffmkyj(fptr, "THEAP", (long)(fptr->Fptr)->heapstart, "&", &tstatus);

    if ((fptr->Fptr)->hdutype == ASCII_TBL)
    {
      /* adjust the TBCOL values of the remaining columns */
      for (ii = 1; ii <= (fptr->Fptr)->tfield; ii++)
      {
        ffkeyn("TBCOL", ii, keyname, status);
        ffgkyjj(fptr, keyname, &tbcol, comm, status);
        if (tbcol > firstcol)
        {
          tbcol = tbcol - delbyte;
          ffmkyj(fptr, keyname, tbcol, "&", status);
        }
      }
    }

    /* update the mandatory keywords */
    ffmkyj(fptr, "TFIELDS", ((fptr->Fptr)->tfield) - 1, "&", status);        
    ffmkyj(fptr,  "NAXIS1",   naxis1 - delbyte, "&", status);
    /*
      delete the index keywords starting with 'T' associated with the 
      deleted column and subtract 1 from index of all higher keywords
    */
    ffkshf(fptr, colnum, (fptr->Fptr)->tfield, -1, status);

    ffrdef(fptr, status);  /* initialize the new table structure */
    return(*status);
}